

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

binarydata *
NetworkDataType::
serializedata<std::__cxx11::string_const,int_const,int_const,int_const,int_const,int_const>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int *args_1,
          int *args_2,int *args_3,int *args_4,int *args_5)

{
  Options OVar1;
  binarydata *in_RDI;
  string *in_stack_00000008;
  PortableBinaryOutputArchive archive;
  ostringstream stream;
  binarydata *in_stack_fffffffffffffcf0;
  binarydata *args_3_00;
  undefined7 in_stack_fffffffffffffd08;
  int *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd18;
  OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *in_stack_fffffffffffffd20;
  ostream *in_stack_fffffffffffffd28;
  PortableBinaryOutputArchive *in_stack_fffffffffffffd30;
  ostringstream local_1a8 [424];
  
  args_3_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  OVar1 = cereal::PortableBinaryOutputArchive::Options::Default();
  cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
             (Options *)in_stack_fffffffffffffd20);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::operator()
            (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             (int *)CONCAT17(OVar1.itsOutputEndianness,in_stack_fffffffffffffd08),(int *)args_3_00,
             (int *)in_RDI,(int *)in_stack_fffffffffffffd30);
  std::__cxx11::ostringstream::str();
  binarydata::binarydata(in_stack_fffffffffffffcf0,in_stack_00000008);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffd10);
  cereal::PortableBinaryOutputArchive::~PortableBinaryOutputArchive
            ((PortableBinaryOutputArchive *)0x1e0730);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return args_3_00;
}

Assistant:

static binarydata serializedata(T & ... args){
        std::ostringstream stream;
        cereal::PortableBinaryOutputArchive archive(stream);
        archive(args...);
        return binarydata(stream.str());
    }